

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

_Bool memequals(void *s1,void *s2,size_t n)

{
  uint uVar1;
  int iVar2;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  int support;
  size_t in_stack_000000e0;
  void *in_stack_000000e8;
  void *in_stack_000000f0;
  size_t in_stack_000001b0;
  void *in_stack_000001b8;
  void *in_stack_000001c0;
  undefined1 local_1;
  
  if (in_RDX == 0) {
    local_1 = true;
  }
  else {
    uVar1 = croaring_hardware_support();
    if ((uVar1 & 2) == 0) {
      if ((uVar1 & 1) == 0) {
        iVar2 = memcmp(in_RDI,in_RSI,in_RDX);
        local_1 = iVar2 == 0;
      }
      else {
        local_1 = _avx2_memequals(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      }
    }
    else {
      local_1 = _avx512_memequals(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
    }
  }
  return local_1;
}

Assistant:

bool memequals(const void *s1, const void *s2, size_t n) {
    if (n == 0) {
        return true;
    }
#if CROARING_IS_X64
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return _avx512_memequals(s1, s2, n);
    } else
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        if (support & ROARING_SUPPORTS_AVX2) {
            return _avx2_memequals(s1, s2, n);
        } else {
            return memcmp(s1, s2, n) == 0;
        }
#else
    return memcmp(s1, s2, n) == 0;
#endif
}